

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextSpan.cpp
# Opt level: O1

ostream * psy::operator<<(ostream *os,TextSpan *span)

{
  ostream *poVar1;
  
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"..",2);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const TextSpan& span)
{
    os << span.start() << ".." << span.end();
    return os;
}